

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

void xmlFreeNs(xmlNsPtr cur)

{
  if (cur != (xmlNsPtr)0x0) {
    if (cur->href != (xmlChar *)0x0) {
      (*xmlFree)(cur->href);
    }
    if (cur->prefix != (xmlChar *)0x0) {
      (*xmlFree)(cur->prefix);
    }
    (*xmlFree)(cur);
    return;
  }
  return;
}

Assistant:

void
xmlFreeNs(xmlNsPtr cur) {
    if (cur == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlFreeNs : ns == NULL\n");
#endif
	return;
    }
    if (cur->href != NULL) xmlFree((char *) cur->href);
    if (cur->prefix != NULL) xmlFree((char *) cur->prefix);
    xmlFree(cur);
}